

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_thread_impl.cc
# Opt level: O3

void __thiscall dd::ProcessThreadImpl::~ProcessThreadImpl(ProcessThreadImpl *this)

{
  _List_node_base *p_Var1;
  PlatformThread *pPVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  _Elt_pointer ppQVar5;
  pointer pDVar6;
  
  (this->super_ProcessThread).super_TaskQueueBase._vptr_TaskQueueBase =
       (_func_int **)&PTR_Delete_0012eb20;
  bVar4 = SequenceCheckerImpl::IsCurrent((SequenceCheckerImpl *)&this->_thread_checker);
  if (!bVar4) {
    __assert_fail("_thread_checker.IsCurrent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x1a,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
  }
  if ((this->_thread)._M_t.
      super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
      super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
      super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl != (PlatformThread *)0x0) {
    __assert_fail("!_thread.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x1b,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
  }
  if (this->_stop != false) {
    __assert_fail("!_stop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/boss-li[P]quick/thread/process_thread_impl.cc"
                  ,0x1c,"virtual dd::ProcessThreadImpl::~ProcessThreadImpl()");
  }
  while (pDVar6 = (this->_delayed_tasks).c.
                  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pDVar6 != (this->_delayed_tasks).c.
                  super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
    if (pDVar6->task != (QueuedTask *)0x0) {
      (*pDVar6->task->_vptr_QueuedTask[1])();
    }
    std::
    priority_queue<dd::ProcessThreadImpl::DelayedTask,_std::vector<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>,_std::less<dd::ProcessThreadImpl::DelayedTask>_>
    ::pop(&this->_delayed_tasks);
  }
  ppQVar5 = (this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  if ((this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur != ppQVar5) {
    do {
      if (*ppQVar5 != (QueuedTask *)0x0) {
        (*(*ppQVar5)->_vptr_QueuedTask[1])();
      }
      std::deque<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::pop_front(&(this->_queue).c);
      ppQVar5 = (this->_queue).c.
                super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
    } while ((this->_queue).c.super__Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur != ppQVar5);
    pDVar6 = (this->_delayed_tasks).c.
             super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  if (pDVar6 != (pointer)0x0) {
    operator_delete(pDVar6,(long)(this->_delayed_tasks).c.
                                 super__Vector_base<dd::ProcessThreadImpl::DelayedTask,_std::allocator<dd::ProcessThreadImpl::DelayedTask>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pDVar6);
  }
  std::_Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_>::~_Deque_base
            ((_Deque_base<dd::QueuedTask_*,_std::allocator<dd::QueuedTask_*>_> *)&this->_queue);
  p_Var3 = (this->_modules).
           super__List_base<dd::ProcessThreadImpl::ModuleCallback,_std::allocator<dd::ProcessThreadImpl::ModuleCallback>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->_modules) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x38);
    p_Var3 = p_Var1;
  }
  pPVar2 = (this->_thread)._M_t.
           super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
           super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
           super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl;
  if (pPVar2 != (PlatformThread *)0x0) {
    (*pPVar2->_vptr_PlatformThread[1])();
  }
  (this->_thread)._M_t.
  super___uniq_ptr_impl<dd::PlatformThread,_std::default_delete<dd::PlatformThread>_>._M_t.
  super__Tuple_impl<0UL,_dd::PlatformThread_*,_std::default_delete<dd::PlatformThread>_>.
  super__Head_base<0UL,_dd::PlatformThread_*,_false>._M_head_impl = (PlatformThread *)0x0;
  Event::~Event(&this->_wake_up);
  SequenceCheckerImpl::~SequenceCheckerImpl((SequenceCheckerImpl *)&this->_thread_checker);
  pthread_mutex_destroy((pthread_mutex_t *)&this->_lock);
  return;
}

Assistant:

ProcessThreadImpl::~ProcessThreadImpl() {
		assert(_thread_checker.IsCurrent());
		assert(!_thread.get());
		assert(!_stop);
		while (!_delayed_tasks.empty()) {
			delete _delayed_tasks.top().task;
			_delayed_tasks.pop();
		}

		while (!_queue.empty()) {
			delete _queue.front();
			_queue.pop();
		}
	}